

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VEnableFusedOps_ManyVector(N_Vector v,int tf)

{
  N_Vector_Ops p_Var1;
  
  p_Var1 = v->ops;
  if (tf == 0) {
    p_Var1->nvdotprodmultilocal = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    p_Var1->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvwrmsnormvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvwrmsnormmaskvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0;
    p_Var1->nvscalevectorarray =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvconstvectorarray = (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr *)0x0;
    p_Var1->nvdotprodmulti = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvlinearsumvectorarray =
         (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvlinearcombination = (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *)0x0;
    p_Var1->nvscaleaddmulti =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
  }
  else {
    p_Var1->nvlinearcombination = N_VLinearCombination_ManyVector;
    p_Var1->nvscaleaddmulti = N_VScaleAddMulti_ManyVector;
    p_Var1->nvdotprodmulti = N_VDotProdMulti_ManyVector;
    p_Var1->nvlinearsumvectorarray = N_VLinearSumVectorArray_ManyVector;
    p_Var1->nvscalevectorarray = N_VScaleVectorArray_ManyVector;
    p_Var1->nvconstvectorarray = N_VConstVectorArray_ManyVector;
    p_Var1->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_ManyVector;
    p_Var1->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;
    p_Var1->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    p_Var1->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VEnableFusedOps)(N_Vector v, sunbooleantype tf)
{
  if (tf)
  {
    /* enable all fused vector operations */
    v->ops->nvlinearcombination = MVAPPEND(N_VLinearCombination);
    v->ops->nvscaleaddmulti     = MVAPPEND(N_VScaleAddMulti);
    v->ops->nvdotprodmulti      = MVAPPEND(N_VDotProdMulti);
    /* enable all vector array operations */
    v->ops->nvlinearsumvectorarray     = MVAPPEND(N_VLinearSumVectorArray);
    v->ops->nvscalevectorarray         = MVAPPEND(N_VScaleVectorArray);
    v->ops->nvconstvectorarray         = MVAPPEND(N_VConstVectorArray);
    v->ops->nvwrmsnormvectorarray      = MVAPPEND(N_VWrmsNormVectorArray);
    v->ops->nvwrmsnormmaskvectorarray  = MVAPPEND(N_VWrmsNormMaskVectorArray);
    v->ops->nvscaleaddmultivectorarray = NULL;
    v->ops->nvlinearcombinationvectorarray = NULL;
    /* enable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = MVAPPEND(N_VDotProdMultiLocal);
  }
  else
  {
    /* disable all fused vector operations */
    v->ops->nvlinearcombination = NULL;
    v->ops->nvscaleaddmulti     = NULL;
    v->ops->nvdotprodmulti      = NULL;
    /* disable all vector array operations */
    v->ops->nvlinearsumvectorarray         = NULL;
    v->ops->nvscalevectorarray             = NULL;
    v->ops->nvconstvectorarray             = NULL;
    v->ops->nvwrmsnormvectorarray          = NULL;
    v->ops->nvwrmsnormmaskvectorarray      = NULL;
    v->ops->nvscaleaddmultivectorarray     = NULL;
    v->ops->nvlinearcombinationvectorarray = NULL;
    /* disable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = NULL;
  }

  /* return success */
  return SUN_SUCCESS;
}